

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segapcm.c
# Opt level: O2

void SEGAPCM_update(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  size_t __n;
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  byte bVar5;
  ushort uVar6;
  long lVar7;
  long lVar8;
  undefined1 uVar11;
  uint uVar9;
  uint uVar10;
  undefined1 uVar12;
  ulong uVar13;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  if (*(long *)((long)chip + 0x28) != 0) {
    for (lVar8 = 0; lVar8 != 0x10; lVar8 = lVar8 + 1) {
      lVar7 = *(long *)((long)chip + 8);
      bVar1 = *(byte *)(lVar7 + 0x86 + lVar8 * 8);
      if (((bVar1 & 1) == 0) && (*(char *)((long)chip + lVar8 + 0x33) == '\0')) {
        bVar2 = *(byte *)((long)chip + 0x31);
        bVar3 = *(byte *)((long)chip + 0x30);
        uVar9 = (uint)CONCAT21(*(undefined2 *)(lVar7 + 0x84 + lVar8 * 8),
                               *(undefined1 *)((long)chip + lVar8 + 0x10));
        uVar6 = *(ushort *)(lVar7 + 4 + lVar8 * 8);
        cVar4 = *(char *)(lVar7 + 6 + lVar8 * 8);
        uVar13 = 0;
        while( true ) {
          uVar11 = (undefined1)(uVar9 >> 8);
          uVar12 = (undefined1)(uVar9 >> 0x10);
          if (samples == uVar13) break;
          if ((uVar9 >> 0x10 == (uint)(byte)(cVar4 + 1)) &&
             (bVar5 = *(byte *)(lVar7 + 0x86 + lVar8 * 8), uVar9 = (uint)uVar6 << 8,
             (bVar5 & 2) != 0)) {
            *(byte *)(lVar7 + 0x86 + lVar8 * 8) = bVar5 | 1;
            *(undefined1 *)(lVar7 + 0x84 + lVar8 * 8) = uVar11;
            *(undefined1 *)(lVar7 + 0x85 + lVar8 * 8) = uVar12;
            uVar11 = 0;
            goto LAB_0013aff1;
          }
          uVar10 = (int)*(char *)(*(long *)((long)chip + 0x28) +
                                 (ulong)(uVar9 >> 8 | (uint)(bVar2 & bVar1) << (bVar3 & 0x1f))) ^
                   0xffffff80;
          (*outputs)[uVar13] =
               (*outputs)[uVar13] + (*(byte *)(lVar7 + 2 + lVar8 * 8) & 0x7f) * uVar10;
          outputs[1][uVar13] =
               outputs[1][uVar13] + (*(byte *)(lVar7 + 3 + lVar8 * 8) & 0x7f) * uVar10;
          uVar9 = *(byte *)(lVar7 + 7 + lVar8 * 8) + uVar9 & 0xffffff;
          uVar13 = uVar13 + 1;
        }
        *(undefined1 *)(lVar7 + 0x84 + lVar8 * 8) = uVar11;
        *(undefined1 *)(lVar7 + 0x85 + lVar8 * 8) = uVar12;
        uVar11 = (char)uVar9;
        if ((*(byte *)(lVar7 + 0x86 + lVar8 * 8) & 1) != 0) {
          uVar11 = 0;
        }
LAB_0013aff1:
        *(undefined1 *)((long)chip + lVar8 + 0x10) = uVar11;
      }
    }
  }
  return;
}

Assistant:

static void SEGAPCM_update(void *chip, UINT32 samples, DEV_SMPL **outputs)
{
	segapcm_state *spcm = (segapcm_state *)chip;
	int ch;

	/* clear the buffers */
	memset(outputs[0], 0, samples*sizeof(DEV_SMPL));
	memset(outputs[1], 0, samples*sizeof(DEV_SMPL));
	if (spcm->rom == NULL)
		return;

	// reg      function
	// ------------------------------------------------
	// 0x00     ?
	// 0x01     ?
	// 0x02     volume left
	// 0x03     volume right
	// 0x04     loop address (08-15)
	// 0x05     loop address (16-23)
	// 0x06     end address
	// 0x07     address delta
	// 0x80     ?
	// 0x81     ?
	// 0x82     ?
	// 0x83     ?
	// 0x84     current address (08-15), 00-07 is internal?
	// 0x85     current address (16-23)
	// 0x86     bit 0: channel disable?
	//          bit 1: loop disable
	//          other bits: bank
	// 0x87     ?

	/* loop over channels */
	for (ch = 0; ch < 16; ch++)
	{
		UINT8 *regs = spcm->ram+8*ch;

		/* only process active channels */
		if (!(regs[0x86] & 1) && ! spcm->Muted[ch])
		{
			UINT32 offset = (regs[0x86] & spcm->bankmask) << spcm->bankshift;
			UINT32 addr = (regs[0x85] << 16) | (regs[0x84] << 8) | spcm->low[ch];
			UINT32 loop = (regs[0x05] << 16) | (regs[0x04] << 8);
			UINT8 end = regs[6] + 1;
			UINT32 i;

			/* loop over samples on this channel */
			for (i = 0; i < samples; i++)
			{
				INT8 v = 0;

				/* handle looping if we've hit the end */
				if ((addr >> 16) == end)
				{
					if (regs[0x86] & 2)
					{
						regs[0x86] |= 1;
						break;
					}
					else addr = loop;
				}

				/* fetch the sample */
				v = spcm->rom[offset | (addr >> 8)] - 0x80;
#ifdef _DEBUG
				if ((spcm->romusage[(offset | addr >> 8)] & 0x03) == 0x02 && (regs[2] || regs[3]))
					printf("Access to empty ROM section! (0x%06X)\n", offset | ((addr >> 8)));
				spcm->romusage[offset | (addr >> 8)] |= 0x01;
#endif

				/* apply panning and advance */
				// fixed Bitmask for volume multiplication, thanks to ctr -Valley Bell
				outputs[0][i] += v * (regs[2] & 0x7F);
				outputs[1][i] += v * (regs[3] & 0x7F);
				addr = (addr + regs[7]) & 0xffffff;
			}

			/* store back the updated address */
			regs[0x84] = addr >> 8;
			regs[0x85] = addr >> 16;
			spcm->low[ch] = regs[0x86] & 1 ? 0 : addr;
		}
	}
}